

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRFromMemory(float **out_rgba,int *width,int *height,uchar *memory,size_t size,char **err)

{
  char cVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  uchar *puVar4;
  uchar *puVar5;
  int *piVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  char *pcVar10;
  ostream *poVar11;
  float *pfVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  size_t jj_1;
  ulong uVar16;
  float *pfVar17;
  long lVar18;
  char *pcVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  EXRTile *pEVar25;
  long lVar26;
  long lVar27;
  size_t jj;
  size_t pixel_size;
  float fVar28;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader exr_header;
  stringstream ss;
  long local_400;
  long local_3e0;
  EXRImage local_3c8;
  EXRTile *local_398;
  long local_390;
  float *local_388;
  long local_380;
  EXRVersion local_374;
  char *local_360;
  char local_350 [16];
  int *local_340 [2];
  int local_330 [10];
  int local_308;
  int local_304;
  int local_300;
  EXRChannelInfo *local_2d8;
  int *local_2d0;
  uint local_2c8;
  int *local_2c0;
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (out_rgba == (float **)0x0 || memory == (uchar *)0x0) {
    piVar6 = (int *)((long)&((EXRHeader *)local_340)->data_window + 8);
    local_340[0] = piVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_340,"Invalid argument for LoadEXRFromMemory","");
    piVar8 = local_340[0];
    if (err != (char **)0x0) {
      pcVar10 = strdup((char *)local_340[0]);
      *err = pcVar10;
    }
    if (piVar8 != piVar6) {
      operator_delete(piVar8);
    }
    return -3;
  }
  memset((EXRHeader *)local_340,0,0x188);
  iVar9 = ParseEXRVersionFromMemory(&local_374,memory,size);
  if (iVar9 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Failed to parse EXR version. code(",0x22);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar10 = strdup(local_360);
      *err = pcVar10;
    }
    if (local_360 != local_350) {
      operator_delete(local_360);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    return iVar9;
  }
  iVar9 = ParseEXRHeaderFromMemory((EXRHeader *)local_340,&local_374,memory,size,err);
  if (iVar9 != 0) {
    return iVar9;
  }
  if (0 < (int)local_2c8) {
    lVar18 = 0;
    do {
      if (local_2d0[lVar18] == 1) {
        local_2c0[lVar18] = 2;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)local_2c8);
  }
  local_3c8.width = 0;
  local_3c8.height = 0;
  local_3c8.num_channels = 0;
  local_3c8.num_tiles = 0;
  local_3c8.level_x = 0;
  local_3c8.level_y = 0;
  local_3c8.images = (uchar **)0x0;
  local_3c8.tiles = (EXRTile *)0x0;
  local_3c8.next_level = (TEXRImage *)0x0;
  iVar9 = LoadEXRImageFromMemory(&local_3c8,(EXRHeader *)local_340,memory,size,err);
  if (iVar9 != 0) {
    return iVar9;
  }
  if (0 < (int)local_2c8) {
    pcVar10 = local_2d8->name + 1;
    uVar21 = 0xffffffff;
    uVar13 = 0;
    uVar24 = 0xffffffff;
    uVar16 = 0xffffffff;
    local_400._0_4_ = -1;
    do {
      cVar1 = ((EXRChannelInfo *)(pcVar10 + -1))->name[0];
      if (cVar1 == 'R') {
        if (*pcVar10 == '\0') {
          uVar21 = uVar13 & 0xffffffff;
        }
      }
      else if (cVar1 == 'A') {
        if (*pcVar10 == '\0') {
          local_400._0_4_ = (int)uVar13;
        }
      }
      else if (cVar1 == 'B') {
        if (*pcVar10 == '\0') {
          uVar16 = uVar13 & 0xffffffff;
        }
      }
      else if ((cVar1 == 'G') && (*pcVar10 == '\0')) {
        uVar24 = uVar13 & 0xffffffff;
      }
      uVar13 = uVar13 + 1;
      pcVar10 = pcVar10 + 0x110;
    } while (local_2c8 != uVar13);
    iVar9 = local_3c8.width;
    iVar7 = local_3c8.height;
    if (local_2c8 == 1) {
      uVar13 = (ulong)local_3c8.width;
      uVar16 = (ulong)local_3c8.height;
      lVar18 = uVar13 * uVar16;
      pfVar12 = (float *)malloc(lVar18 * 0x10);
      *out_rgba = pfVar12;
      if (local_308 == 0) {
        if (lVar18 != 0) {
          puVar2 = *local_3c8.images;
          lVar22 = 0;
          do {
            fVar28 = *(float *)(puVar2 + lVar22 * 4);
            *pfVar12 = fVar28;
            pfVar12[1] = fVar28;
            pfVar12[2] = fVar28;
            pfVar12[3] = fVar28;
            lVar22 = lVar22 + 1;
            pfVar12 = pfVar12 + 4;
          } while (lVar18 - lVar22 != 0);
        }
      }
      else if (0 < (long)local_3c8.num_tiles) {
        lVar18 = (long)local_304;
        local_400 = 0;
        do {
          if (local_300 != 0) {
            pEVar25 = local_3c8.tiles + local_400;
            lVar22 = 0;
            lVar27 = 0;
            do {
              if (local_304 != 0) {
                uVar24 = pEVar25->offset_x * lVar18;
                uVar21 = (long)pEVar25->offset_y * (long)local_300 + lVar27;
                pfVar17 = pfVar12 + (uVar13 * uVar21 + uVar24) * 4 + 3;
                lVar14 = lVar18;
                lVar26 = lVar22;
                do {
                  if ((uVar24 < uVar13) && (uVar21 < uVar16)) {
                    puVar2 = *pEVar25->images;
                    fVar28 = *(float *)(puVar2 + lVar26);
                    pfVar17[-3] = fVar28;
                    pfVar17[-2] = fVar28;
                    fVar28 = *(float *)(puVar2 + lVar26);
                    pfVar17[-1] = fVar28;
                    *pfVar17 = fVar28;
                  }
                  pfVar17 = pfVar17 + 4;
                  uVar24 = uVar24 + 1;
                  lVar26 = lVar26 + 4;
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
              lVar27 = lVar27 + 1;
              lVar22 = lVar22 + lVar18 * 4;
            } while (lVar27 != local_300);
          }
          local_400 = local_400 + 1;
        } while (local_400 != local_3c8.num_tiles);
      }
LAB_00106b3c:
      *width = iVar9;
      *height = iVar7;
      FreeEXRHeader((EXRHeader *)local_340);
      FreeEXRImage(&local_3c8);
      return 0;
    }
    iVar20 = (int)uVar21;
    if (iVar20 != -1) {
      iVar23 = (int)uVar24;
      if (iVar23 == -1) {
        pcVar19 = "G channel not found";
        pcVar10 = "";
      }
      else {
        iVar15 = (int)uVar16;
        if (iVar15 != -1) {
          uVar16 = (ulong)local_3c8.width;
          uVar13 = (ulong)local_3c8.height;
          lVar18 = uVar16 * uVar13;
          pfVar12 = (float *)malloc(lVar18 * 0x10);
          *out_rgba = pfVar12;
          if (local_308 == 0) {
            if (lVar18 != 0) {
              puVar2 = local_3c8.images[iVar20];
              puVar4 = local_3c8.images[iVar23];
              puVar5 = local_3c8.images[iVar15];
              pfVar12 = pfVar12 + 3;
              lVar22 = 0;
              do {
                pfVar12[-3] = *(float *)(puVar2 + lVar22 * 4);
                pfVar12[-2] = *(float *)(puVar4 + lVar22 * 4);
                pfVar12[-1] = *(float *)(puVar5 + lVar22 * 4);
                fVar28 = 1.0;
                if ((int)local_400 != -1) {
                  fVar28 = *(float *)(local_3c8.images[(int)local_400] + lVar22 * 4);
                }
                *pfVar12 = fVar28;
                lVar22 = lVar22 + 1;
                pfVar12 = pfVar12 + 4;
              } while (lVar18 - lVar22 != 0);
            }
          }
          else {
            local_390 = (long)local_3c8.num_tiles;
            if (0 < local_390) {
              lVar18 = (long)local_304;
              local_398 = local_3c8.tiles;
              local_380 = lVar18 * 4;
              local_388 = pfVar12 + 3;
              local_3e0 = 0;
              do {
                if (local_300 != 0) {
                  pEVar25 = local_3c8.tiles + local_3e0;
                  lVar22 = 0;
                  lVar27 = 0;
                  do {
                    if (local_304 != 0) {
                      uVar24 = pEVar25->offset_x * lVar18;
                      uVar21 = (long)pEVar25->offset_y * (long)local_300 + lVar27;
                      pfVar12 = local_388 + (uVar16 * uVar21 + uVar24) * 4;
                      lVar14 = lVar22;
                      lVar26 = lVar18;
                      do {
                        if ((uVar24 < uVar16) && (uVar21 < uVar13)) {
                          ppuVar3 = pEVar25->images;
                          pfVar12[-3] = *(float *)(ppuVar3[iVar20] + lVar14);
                          pfVar12[-2] = *(float *)(ppuVar3[iVar23] + lVar14);
                          pfVar12[-1] = *(float *)(ppuVar3[iVar15] + lVar14);
                          fVar28 = 1.0;
                          if ((int)local_400 != -1) {
                            fVar28 = *(float *)(ppuVar3[(int)local_400] + lVar14);
                          }
                          *pfVar12 = fVar28;
                        }
                        lVar14 = lVar14 + 4;
                        pfVar12 = pfVar12 + 4;
                        uVar24 = uVar24 + 1;
                        lVar26 = lVar26 + -1;
                      } while (lVar26 != 0);
                    }
                    lVar27 = lVar27 + 1;
                    lVar22 = lVar22 + local_380;
                  } while (lVar27 != local_300);
                }
                local_3e0 = local_3e0 + 1;
              } while (local_3e0 != local_390);
            }
          }
          goto LAB_00106b3c;
        }
        pcVar19 = "B channel not found";
        pcVar10 = "";
      }
      goto LAB_00106a04;
    }
  }
  pcVar19 = "R channel not found";
  pcVar10 = "";
LAB_00106a04:
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar19,pcVar10);
  poVar11 = local_1b8[0];
  if (err != (char **)0x0) {
    pcVar10 = strdup((char *)local_1b8[0]);
    *err = pcVar10;
  }
  if (poVar11 != local_1a8) {
    operator_delete(poVar11);
  }
  return -4;
}

Assistant:

int LoadEXRFromMemory(float **out_rgba, int *width, int *height,
                      const unsigned char *memory, size_t size,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory, size);
  if (ret != TINYEXR_SUCCESS) {
    std::stringstream ss;
    ss << "Failed to parse EXR version. code(" << ret << ")";
    tinyexr::SetErrorMessage(ss.str(), err);
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  // TODO(syoyo): Refactor removing same code as used in LoadEXR().
  if (exr_header.num_channels == 1) {
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[0][srcIdx];
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        const float val = reinterpret_cast<float **>(exr_image.images)[0][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }

  } else {
    // TODO(syoyo): Support non RGBA image.

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++)
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}